

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall
Reset_hasResetFromComponentMethod_Test::~Reset_hasResetFromComponentMethod_Test
          (Reset_hasResetFromComponentMethod_Test *this)

{
  Reset_hasResetFromComponentMethod_Test *this_local;
  
  ~Reset_hasResetFromComponentMethod_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, hasResetFromComponentMethod)
{
    const std::string in = "valid_name";
    libcellml::ComponentPtr c = libcellml::Component::create();
    c->setName(in);

    libcellml::ResetPtr r1 = libcellml::Reset::create();
    r1->setTestValue("r1s test value");
    c->addReset(r1);

    libcellml::ResetPtr r2 = libcellml::Reset::create();
    r2->setTestValue("r2s test value");
    c->addReset(r2);

    libcellml::ResetPtr r3 = libcellml::Reset::create();

    EXPECT_TRUE(c->hasReset(r2));
    EXPECT_FALSE(c->hasReset(r3));
}